

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness-traversal.h
# Opt level: O0

void wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>::
     doVisitLocalGet(SpillPointers *self,Expression **currp)

{
  bool bVar1;
  Module *wasm;
  What local_54;
  uintptr_t local_50;
  Expression *local_48;
  initializer_list<wasm::Expression_*> local_40;
  Block *local_30;
  Expression *rep;
  Builder builder;
  LocalGet *curr;
  Expression **currp_local;
  SpillPointers *self_local;
  
  curr = (LocalGet *)currp;
  currp_local = (Expression **)self;
  builder.wasm = (Module *)Expression::cast<wasm::LocalGet>(*currp);
  if (currp_local[0x37] == (Expression *)0x0) {
    wasm = Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>::getModule
                     ((Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_> *)
                      (currp_local + 6));
    Builder::Builder((Builder *)&rep,wasm);
    local_30 = (Block *)Builder::replaceWithIdenticalType<wasm::LocalGet>
                                  ((Builder *)&rep,(LocalGet *)builder.wasm);
    bVar1 = Expression::is<wasm::LocalGet>((Expression *)local_30);
    if (bVar1) {
      local_48 = (Expression *)Builder::makeUnreachable((Builder *)&rep);
      local_40._M_array = &local_48;
      local_40._M_len = 1;
      local_50 = (uintptr_t)
                 ((builder.wasm)->exports).
                 super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      local_30 = Builder::makeBlock((Builder *)&rep,&local_40,(Type)local_50);
    }
    *(Block **)&(curr->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression =
         local_30;
  }
  else {
    local_54 = Get;
    std::vector<wasm::LivenessAction,std::allocator<wasm::LivenessAction>>::
    emplace_back<wasm::LivenessAction::What,unsigned_int&,wasm::Expression**&>
              ((vector<wasm::LivenessAction,std::allocator<wasm::LivenessAction>> *)
               (currp_local[0x37] + 3),&local_54,
               (uint *)&((builder.wasm)->exports).
                        super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(Expression ***)&curr);
  }
  return;
}

Assistant:

static void doVisitLocalGet(SubType* self, Expression** currp) {
    auto* curr = (*currp)->cast<LocalGet>();
    // if in unreachable code, ignore
    if (!self->currBasicBlock) {
      Builder builder(*self->getModule());
      auto* rep = builder.replaceWithIdenticalType(curr);
      if (rep->is<LocalGet>()) {
        // We failed to replace the node with something simpler. This can happen
        // if the local is non-nullable, for example. We still need to remove
        // this node entirely, however, as it is unreachable and so we will not
        // see it in the analysis we perform (for example, we may be changing
        // local indexes). Replace it with something completely different, even
        // if it is larger, a block with a forced type that has unreachable
        // contents,
        //
        //  (block (result X)
        //   (unreachable))
        //
        // That pattern lets us set any type we wish.
        //
        // TODO: Make a helper function for this, if it is useful in other
        //       places.
        rep = builder.makeBlock({builder.makeUnreachable()}, curr->type);
      }
      *currp = rep;
      return;
    }
    self->currBasicBlock->contents.actions.emplace_back(
      LivenessAction::Get, curr->index, currp);
  }